

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O3

int get_refresh_idx(RefFrameMapPair *ref_frame_map_pairs,int update_arf,GF_GROUP *gf_group,
                   int gf_index,int enable_refresh_skip,int cur_frame_disp)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  int local_38;
  
  local_38 = -1;
  iVar8 = 0x7fffffff;
  uVar9 = 0;
  iVar7 = 0;
  iVar4 = 0x7fffffff;
  uVar5 = 0xffffffff;
  do {
    iVar1 = ref_frame_map_pairs[uVar9].disp_order;
    if (iVar1 <= cur_frame_disp + -3 && iVar1 != -1) {
      if (enable_refresh_skip != 0) {
        bVar3 = false;
        uVar6 = 0;
        do {
          iVar2 = gf_group->skip_frame_refresh[gf_index][uVar6];
          if (iVar2 == -1) break;
          if (iVar1 == iVar2) {
            bVar3 = true;
            break;
          }
          bVar10 = uVar6 < 7;
          uVar6 = uVar6 + 1;
        } while (bVar10);
        if (bVar3) goto LAB_00b9cd4b;
      }
      if (ref_frame_map_pairs[uVar9].pyr_level == 1) {
        if (iVar1 < iVar8) {
          local_38 = (int)uVar9;
          iVar8 = iVar1;
        }
        iVar7 = iVar7 + 1;
      }
      else if (iVar1 < iVar4) {
        uVar5 = uVar9 & 0xffffffff;
        iVar4 = iVar1;
      }
    }
LAB_00b9cd4b:
    uVar9 = uVar9 + 1;
    if (uVar9 == 8) {
      iVar8 = local_38;
      if ((((update_arf == 0 || iVar7 < 3) && (iVar4 = (int)uVar5, iVar8 = iVar4, iVar4 < 0)) &&
          (iVar8 = local_38, local_38 < 0)) && (iVar4 != -1)) {
        iVar8 = -1;
      }
      return iVar8;
    }
  } while( true );
}

Assistant:

static int get_refresh_idx(RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
                           int update_arf, GF_GROUP *gf_group, int gf_index,
                           int enable_refresh_skip, int cur_frame_disp) {
  int arf_count = 0;
  int oldest_arf_order = INT32_MAX;
  int oldest_arf_idx = -1;

  int oldest_frame_order = INT32_MAX;
  int oldest_idx = -1;

  for (int map_idx = 0; map_idx < REF_FRAMES; map_idx++) {
    RefFrameMapPair ref_pair = ref_frame_map_pairs[map_idx];
    if (ref_pair.disp_order == -1) continue;
    const int frame_order = ref_pair.disp_order;
    const int reference_frame_level = ref_pair.pyr_level;
    // Keep future frames and three closest previous frames in output order.
    if (frame_order > cur_frame_disp - 3) continue;

    if (enable_refresh_skip) {
      int skip_frame = 0;
      // Prevent refreshing a frame in gf_group->skip_frame_refresh.
      for (int i = 0; i < REF_FRAMES; i++) {
        int frame_to_skip = gf_group->skip_frame_refresh[gf_index][i];
        if (frame_to_skip == INVALID_IDX) break;
        if (frame_order == frame_to_skip) {
          skip_frame = 1;
          break;
        }
      }
      if (skip_frame) continue;
    }

    // Keep track of the oldest level 1 frame if the current frame is also level
    // 1.
    if (reference_frame_level == 1) {
      // If there are more than 2 level 1 frames in the reference list,
      // discard the oldest.
      if (frame_order < oldest_arf_order) {
        oldest_arf_order = frame_order;
        oldest_arf_idx = map_idx;
      }
      arf_count++;
      continue;
    }

    // Update the overall oldest reference frame.
    if (frame_order < oldest_frame_order) {
      oldest_frame_order = frame_order;
      oldest_idx = map_idx;
    }
  }
  if (update_arf && arf_count > 2) return oldest_arf_idx;
  if (oldest_idx >= 0) return oldest_idx;
  if (oldest_arf_idx >= 0) return oldest_arf_idx;
  if (oldest_idx == -1) {
    assert(arf_count > 2 && enable_refresh_skip);
    return oldest_arf_idx;
  }
  assert(0 && "No valid refresh index found");
  return -1;
}